

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execCas<(moira::Core)2,(moira::Instr)143,(moira::Mode)4,1>(Moira *this,u16 opcode)

{
  ushort uVar1;
  uint uVar2;
  byte bVar3;
  u32 uVar4;
  int iVar5;
  ulong uVar6;
  u32 ea;
  u32 data;
  u32 local_30;
  uint local_2c;
  
  this->cp = 0;
  uVar1 = (this->queue).irc;
  uVar6 = (ulong)(uVar1 & 7);
  uVar4 = (this->reg).pc + 2;
  (this->reg).pc = uVar4;
  uVar4 = read<(moira::Core)2,(moira::AddrSpace)2,2,0ull>(this,uVar4);
  (this->queue).irc = (u16)uVar4;
  readOp<(moira::Core)2,(moira::Mode)4,1,64ull>(this,opcode & 7,&local_30,&local_2c);
  uVar2 = *(uint *)((long)&(this->reg).field_3 + uVar6 * 4);
  iVar5 = local_2c - (uVar2 & 0xff);
  (this->reg).sr.c = (bool)((byte)((uint)iVar5 >> 8) & 1);
  bVar3 = (byte)iVar5;
  (this->reg).sr.v = (bool)((byte)((bVar3 ^ (byte)local_2c) & ((byte)local_2c ^ (byte)uVar2)) >> 7);
  (this->reg).sr.z = bVar3 == 0;
  (this->reg).sr.n = (bool)(bVar3 >> 7);
  if (bVar3 == 0) {
    write<(moira::Core)2,(moira::AddrSpace)1,1,0ull>
              (this,local_30,
               (uint)*(byte *)((long)&(this->reg).field_3 + (ulong)(uVar1 >> 4 & 0x1c)));
    iVar5 = 0x14;
  }
  else {
    *(uint *)((long)&(this->reg).field_3 + uVar6 * 4) = uVar2 & 0xffffff00 | local_2c;
    iVar5 = 0x11;
  }
  (*this->_vptr_Moira[2])(this,(ulong)(uint)(iVar5 + this->cp));
  uVar4 = (this->reg).pc;
  (this->reg).pc0 = uVar4;
  (this->queue).ird = (this->queue).irc;
  uVar4 = read<(moira::Core)2,(moira::AddrSpace)2,2,4ull>(this,uVar4 + 2);
  (this->queue).irc = (u16)uVar4;
  this->readBuffer = (u16)uVar4;
  return;
}

Assistant:

void
Moira::execCas(u16 opcode)
{
    AVAILABILITY(Core::C68020)

    int dst = _____________xxx(opcode);
    int dc  = _____________xxx(queue.irc);
    int du  = _______xxx______(queue.irc);

    u32 ea, data;

    readExt<C>();
    readOp<C, M, S, STD_AE_FRAME>(dst, &ea, &data);

    auto compare = readD(dc);

    // Set flags
    cmp<C, S>(CLIP<S>(compare), data);

    if (!reg.sr.z) {

        writeD(dc, CLEAR<S>(compare) | data);

        //           00  10  20        00  10  20        00  10  20
        //           .b  .b  .b        .w  .w  .w        .l  .l  .l
        CYCLES_AI   ( 0,  0, 16,        0,  0, 16,        0,  0, 16)
        CYCLES_PI   ( 0,  0, 16,        0,  0, 16,        0,  0, 16)
        CYCLES_PD   ( 0,  0, 17,        0,  0, 17,        0,  0, 17)
        CYCLES_DI   ( 0,  0, 17,        0,  0, 17,        0,  0, 17)
        CYCLES_IX   ( 0,  0, 19,        0,  0, 19,        0,  0, 19)
        CYCLES_AW   ( 0,  0, 16,        0,  0, 16,        0,  0, 16)
        CYCLES_AL   ( 0,  0, 16,        0,  0, 16,        0,  0, 16)

    } else {

        writeM<C, M, S>(ea, readD<S>(du));

        //           00  10  20        00  10  20        00  10  20
        //           .b  .b  .b        .w  .w  .w        .l  .l  .l
        CYCLES_AI   ( 0,  0, 19,        0,  0, 19,        0,  0, 19)
        CYCLES_PI   ( 0,  0, 19,        0,  0, 19,        0,  0, 19)
        CYCLES_PD   ( 0,  0, 20,        0,  0, 20,        0,  0, 20)
        CYCLES_DI   ( 0,  0, 20,        0,  0, 20,        0,  0, 20)
        CYCLES_IX   ( 0,  0, 22,        0,  0, 22,        0,  0, 22)
        CYCLES_AW   ( 0,  0, 19,        0,  0, 19,        0,  0, 19)
        CYCLES_AL   ( 0,  0, 19,        0,  0, 19,        0,  0, 19)
    }

    prefetch<C, POLL>();

    FINALIZE
}